

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O3

ZyanStatus
ZydisReadDisplacement(ZydisDecoderState *state,ZydisDecodedInstruction *instruction,ZyanU8 size)

{
  byte bVar1;
  ZyanU8 *pZVar2;
  ulong uVar3;
  long lVar4;
  ZyanUSize ZVar5;
  
  if ((instruction->raw).disp.size != '\0') {
    __assert_fail("instruction->raw.disp.size == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x2db,
                  "ZyanStatus ZydisReadDisplacement(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU8)"
                 );
  }
  (instruction->raw).disp.size = size;
  bVar1 = instruction->length;
  (instruction->raw).disp.offset = bVar1;
  switch((uint)size << 0x1d | size - 8 >> 3) {
  case 0:
    if (0xe < bVar1) {
      return 0x80200002;
    }
    ZVar5 = state->buffer_len;
    if (ZVar5 == 0) {
      return 0x80200000;
    }
    pZVar2 = state->buffer;
    state->buffer = pZVar2 + 1;
    lVar4 = (long)(char)*pZVar2;
    instruction->length = bVar1 + 1;
    ZVar5 = ZVar5 - 1;
    break;
  case 1:
    if (0xd < bVar1) {
      return 0x80200002;
    }
    uVar3 = state->buffer_len;
    if (uVar3 < 2) {
      return 0x80200000;
    }
    instruction->length = bVar1 + 2;
    lVar4 = (long)*(short *)state->buffer;
    state->buffer = (ZyanU8 *)((long)state->buffer + 2);
    ZVar5 = uVar3 - 2;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x2ff,
                  "ZyanStatus ZydisReadDisplacement(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU8)"
                 );
  case 3:
    if (0xb < bVar1) {
      return 0x80200002;
    }
    uVar3 = state->buffer_len;
    if (uVar3 < 4) {
      return 0x80200000;
    }
    instruction->length = bVar1 + 4;
    lVar4 = (long)*(int *)state->buffer;
    state->buffer = (ZyanU8 *)((long)state->buffer + 4);
    ZVar5 = uVar3 - 4;
    break;
  case 7:
    if (7 < bVar1) {
      return 0x80200002;
    }
    uVar3 = state->buffer_len;
    if (uVar3 < 8) {
      return 0x80200000;
    }
    instruction->length = bVar1 + 8;
    lVar4 = *(long *)state->buffer;
    state->buffer = (ZyanU8 *)((long)state->buffer + 8);
    ZVar5 = uVar3 - 8;
  }
  state->buffer_len = ZVar5;
  (instruction->raw).disp.value = lVar4;
  return 0x100000;
}

Assistant:

static ZyanStatus ZydisReadDisplacement(ZydisDecoderState* state,
    ZydisDecodedInstruction* instruction, ZyanU8 size)
{
    ZYAN_ASSERT(state);
    ZYAN_ASSERT(instruction);
    ZYAN_ASSERT(instruction->raw.disp.size == 0);

    instruction->raw.disp.size = size;
    instruction->raw.disp.offset = instruction->length;

    switch (size)
    {
    case 8:
    {
        ZyanU8 value;
        ZYAN_CHECK(ZydisInputNext(state, instruction, &value));
        instruction->raw.disp.value = *(ZyanI8*)&value;
        break;
    }
    case 16:
    {
        ZyanU16 value;
        ZYAN_CHECK(ZydisInputNextBytes(state, instruction, (ZyanU8*)&value, 2));
        instruction->raw.disp.value = *(ZyanI16*)&value;
        break;
    }
    case 32:
    {
        ZyanU32 value;
        ZYAN_CHECK(ZydisInputNextBytes(state, instruction, (ZyanU8*)&value, 4));
        instruction->raw.disp.value = *(ZyanI32*)&value;
        break;
    }
    case 64:
    {
        ZyanU64 value;
        ZYAN_CHECK(ZydisInputNextBytes(state, instruction, (ZyanU8*)&value, 8));
        instruction->raw.disp.value = *(ZyanI64*)&value;
        break;
    }
    default:
        ZYAN_UNREACHABLE;
    }

    // TODO: Fix endianess on big-endian systems

    return ZYAN_STATUS_SUCCESS;
}